

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int plan2duu(PlannerType plannerType,char *envCfgFilename)

{
  char cVar1;
  int iVar2;
  int iVar3;
  SBPL_Exception *pSVar4;
  float ProbofReachGoal;
  float ExpectedCost;
  MDPConfig MDPCfg;
  PPCPPlanner planner;
  vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
  SolutionPolicy;
  EnvironmentNAV2DUU environment_nav2Duu;
  
  EnvironmentNAV2DUU::EnvironmentNAV2DUU(&environment_nav2Duu);
  cVar1 = EnvironmentNAV2DUU::InitializeEnv((char *)&environment_nav2Duu);
  if (cVar1 == '\0') {
    pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: InitializeEnv failed");
  }
  else {
    cVar1 = EnvironmentNAV2DUU::InitializeMDPCfg((MDPConfig *)&environment_nav2Duu);
    if (cVar1 != '\0') {
      iVar2 = EnvironmentNAV2DUU::SizeofCreatedEnv();
      iVar3 = EnvironmentNAV2DUU::SizeofH();
      PPCPPlanner::PPCPPlanner
                (&planner,(DiscreteSpaceInformation *)&environment_nav2Duu,iVar2,iVar3);
      iVar2 = PPCPPlanner::set_start((int)&planner);
      if (iVar2 == 0) {
        pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: failed to set start state");
      }
      else {
        iVar2 = PPCPPlanner::set_goal((int)&planner);
        if (iVar2 != 0) {
          puts("start planning...");
          SolutionPolicy.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          SolutionPolicy.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          SolutionPolicy.
          super__Vector_base<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          iVar2 = PPCPPlanner::replan(10.0,(vector *)&planner,(float *)&SolutionPolicy,&ExpectedCost
                                     );
          puts("done planning");
          if (iVar2 == 0) {
            puts("Solution does not exist");
          }
          else {
            printf("Solution is found: exp. cost=%f probofreachgoal=%f\n",
                   SUB84((double)ExpectedCost,0),(double)ProbofReachGoal);
          }
          fflush((FILE *)0x0);
          std::
          vector<POLICYBELIEFSTATEWITHBINARYHVALS,_std::allocator<POLICYBELIEFSTATEWITHBINARYHVALS>_>
          ::~vector(&SolutionPolicy);
          PPCPPlanner::~PPCPPlanner(&planner);
          DiscreteSpaceInformation::~DiscreteSpaceInformation
                    ((DiscreteSpaceInformation *)&environment_nav2Duu);
          return iVar2;
        }
        pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
        SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: failed to set goal state");
      }
      __cxa_throw(pSVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
    }
    pSVar4 = (SBPL_Exception *)__cxa_allocate_exception(0x10);
    SBPL_Exception::SBPL_Exception(pSVar4,"ERROR: InitializeMDPCfg failed");
  }
  __cxa_throw(pSVar4,&SBPL_Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int plan2duu(PlannerType plannerType, char* envCfgFilename)
{
    int bRet = 0;
    double allocated_time_secs = 10.0; //in seconds
    MDPConfig MDPCfg;

    //Initialize Environment (should be called before initializing anything else)
    EnvironmentNAV2DUU environment_nav2Duu;
    if (!environment_nav2Duu.InitializeEnv(envCfgFilename)) {
        throw SBPL_Exception("ERROR: InitializeEnv failed");
    }

    //Initialize MDP Info
    if (!environment_nav2Duu.InitializeMDPCfg(&MDPCfg)) {
        throw SBPL_Exception("ERROR: InitializeMDPCfg failed");
    }

    //create the planner
    PPCPPlanner planner(&environment_nav2Duu, environment_nav2Duu.SizeofCreatedEnv(), environment_nav2Duu.SizeofH());

    //set start and goal
    if (planner.set_start(MDPCfg.startstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set start state");
    }
    if (planner.set_goal(MDPCfg.goalstateid) == 0) {
        throw SBPL_Exception("ERROR: failed to set goal state");
    }

    printf("start planning...\n");
    float ExpectedCost, ProbofReachGoal;
    vector<sbpl_PolicyStatewithBinaryh_t> SolutionPolicy;
    bRet = planner.replan(allocated_time_secs, &SolutionPolicy, &ExpectedCost, &ProbofReachGoal);
    printf("done planning\n");

    if (bRet) {
        //print the solution
        printf("Solution is found: exp. cost=%f probofreachgoal=%f\n", ExpectedCost, ProbofReachGoal);
    }
    else {
        printf("Solution does not exist\n");
    }

    fflush(NULL);

    return bRet;
}